

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  MemPage *pMVar2;
  BtShared *pBVar3;
  u8 *puVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Pgno *pPVar10;
  int iVar11;
  undefined8 uVar12;
  undefined4 in_register_00000014;
  uint uVar13;
  int iVar14;
  long lVar15;
  uchar *__src;
  uchar *__dest;
  size_t __n;
  uint uVar16;
  ulong uVar17;
  uchar *puVar18;
  Pgno nextPage;
  DbPage *pDbPage;
  uint local_68;
  uint local_64;
  ulong local_60;
  int local_54;
  uchar *local_50;
  BtShared *local_48;
  int local_3c;
  PgHdr *local_38;
  
  local_60 = CONCAT44(in_register_00000014,amt);
  pMVar2 = pCur->apPage[pCur->iPage];
  pBVar3 = pCur->pBt;
  local_54 = eOp;
  getCellInfo(pCur);
  puVar4 = (pCur->info).pPayload;
  uVar1 = (pCur->info).nLocal;
  uVar8 = (uint)uVar1;
  uVar12 = 0xf774;
  local_48 = pBVar3;
  if ((ulong)(pBVar3->usableSize - uVar8) < (ulong)((long)puVar4 - (long)pMVar2->aData))
  goto LAB_00129403;
  if (uVar8 < offset || uVar8 - offset == 0) {
    uVar17 = (ulong)(offset - uVar1);
    iVar7 = 0;
    local_50 = pBuf;
  }
  else {
    iVar11 = uVar8 - offset;
    if ((int)local_60 + offset <= (uint)uVar1) {
      iVar11 = (int)local_60;
    }
    __n = (size_t)iVar11;
    if (local_54 == 0) {
      memcpy(pBuf,puVar4 + offset,__n);
LAB_001291da:
      iVar7 = 0;
    }
    else {
      iVar7 = sqlite3PagerWrite(pMVar2->pDbPage);
      if (iVar7 == 0) {
        memcpy(puVar4 + offset,pBuf,__n);
        goto LAB_001291da;
      }
    }
    local_50 = pBuf + __n;
    local_60 = (ulong)(uint)((int)local_60 - iVar11);
    uVar17 = 0;
  }
  if ((iVar7 == 0) && ((int)local_60 != 0)) {
    local_64 = local_48->usableSize - 4;
    uVar1 = (pCur->info).nLocal;
    uVar8 = *(uint *)(puVar4 + uVar1);
    local_68 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
    if ((pCur->curFlags & 4) == 0) {
      iVar7 = 0;
      uVar8 = (((local_48->usableSize - (uint)uVar1) + (pCur->info).nPayload) - 5) / local_64;
      if ((int)uVar8 <= pCur->nOvflAlloc) {
LAB_0012926a:
        lVar15 = 0;
        memset(pCur->aOverflow,0,(long)(int)uVar8 << 2);
        pCur->curFlags = pCur->curFlags | 4;
        goto LAB_001292a8;
      }
      pPVar10 = (Pgno *)sqlite3Realloc(pCur->aOverflow,(long)(int)(uVar8 * 2) << 2);
      if (pPVar10 != (Pgno *)0x0) {
        pCur->nOvflAlloc = uVar8 * 2;
        pCur->aOverflow = pPVar10;
        goto LAB_0012926a;
      }
      iVar14 = 7;
LAB_001293ea:
      iVar11 = iVar14;
      bVar6 = false;
    }
    else {
      uVar5 = uVar17 / local_64;
      lVar15 = 0;
      if (pCur->aOverflow[uVar5] != 0) {
        lVar15 = (long)(int)uVar5;
        local_68 = pCur->aOverflow[lVar15];
        uVar17 = uVar17 % (ulong)local_64;
      }
LAB_001292a8:
      bVar6 = true;
      if (local_68 == 0) {
        iVar11 = 7;
        iVar7 = 0;
      }
      else {
        local_3c = (uint)(local_54 == 0) * 2;
        iVar11 = 7;
        lVar15 = lVar15 * 4;
        uVar8 = local_64;
        do {
          pPVar10 = pCur->aOverflow;
          *(uint *)((long)pPVar10 + lVar15) = local_68;
          uVar16 = (uint)uVar17;
          uVar13 = uVar16 - uVar8;
          if (uVar16 < uVar8) {
            iVar14 = uVar8 - uVar16;
            if ((int)local_60 + uVar16 <= uVar8) {
              iVar14 = (int)local_60;
            }
            iVar7 = (*local_48->pPager->xGet)(local_48->pPager,local_68,&local_38,local_3c);
            if (iVar7 == 0) {
              puVar18 = (uchar *)((ulong)(uVar16 + 4) + (long)local_38->pData);
              uVar8 = *local_38->pData;
              local_68 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                         uVar8 << 0x18;
              __src = puVar18;
              __dest = local_50;
              if ((local_54 == 0) ||
                 (iVar7 = sqlite3PagerWrite(local_38), __src = local_50, __dest = puVar18,
                 iVar7 == 0)) {
                memcpy(__dest,__src,(long)iVar14);
                iVar7 = 0;
              }
              uVar17 = 0;
              if (local_38 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_38);
              }
            }
            iVar9 = iVar14;
            if ((int)local_60 == iVar14) {
              iVar9 = 0;
            }
            uVar8 = (int)local_60 - iVar14;
            local_60 = (ulong)uVar8;
            iVar14 = iVar7;
            if (uVar8 == 0) goto LAB_001293ea;
            local_50 = local_50 + iVar9;
            uVar8 = local_64;
          }
          else {
            uVar16 = *(uint *)((long)pPVar10 + lVar15 + 4);
            if (uVar16 == 0) {
              iVar7 = getOverflowPage(local_48,local_68,(MemPage **)0x0,&local_68);
              uVar8 = local_64;
            }
            else {
              iVar7 = 0;
              local_68 = uVar16;
            }
            uVar17 = (ulong)uVar13;
          }
          if (iVar7 != 0) goto LAB_001293d6;
          lVar15 = lVar15 + 4;
        } while (local_68 != 0);
        iVar7 = 0;
LAB_001293d6:
        bVar6 = true;
      }
    }
    if (!bVar6) {
      return iVar11;
    }
  }
  if (iVar7 != 0) {
    return iVar7;
  }
  uVar12 = 0xf807;
  if ((int)local_60 == 0) {
    return 0;
  }
LAB_00129403:
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar12,
              "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
  return 0xb;
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */ 
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->apPage[pCur->iPage]; /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->aiIdx[pCur->iPage]<pPage->nCell );
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_BKPT;
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( nOvfl>pCur->nOvflAlloc ){
        Pgno *aNew = (Pgno*)sqlite3Realloc(
            pCur->aOverflow, nOvfl*2*sizeof(Pgno)
        );
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->nOvflAlloc = nOvfl*2;
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
        sqlite3_file *fd;      /* File from which to do direct overflow read */
#endif
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and 
        **   2) data is required from the start of this overflow page, and
        **   3) there is no open write-transaction, and
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer 
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && pBt->inTransaction==TRANS_READ                     /* (3) */
         && (fd = sqlite3PagerFile(pBt->pPager))->pMethods     /* (4) */
         && 0==sqlite3PagerUseWal(pBt->pPager, nextPage)       /* (5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    return SQLITE_CORRUPT_BKPT; /* Overflow chain ends prematurely */
  }
  return rc;
}